

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall
MissingDependencyScannerTest::MissingDependencyScannerTest(MissingDependencyScannerTest *this)

{
  Test *this_00;
  bool bVar1;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string err;
  string local_68;
  allocator<char> local_31;
  string local_30;
  MissingDependencyScannerTest *local_10;
  MissingDependencyScannerTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MissingDependencyScannerTest_002a8990;
  MissingDependencyTestDelegate::MissingDependencyTestDelegate(&this->delegate_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"generator_rule",&local_31)
  ;
  Rule::Rule(&this->generator_rule_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"compile_rule",(allocator<char> *)(err.field_2._M_local_buf + 0xf))
  ;
  Rule::Rule(&this->compile_rule_,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
  DepsLog::DepsLog(&this->deps_log_);
  State::State(&this->state_);
  VirtualFileSystem::VirtualFileSystem(&this->filesystem_);
  MissingDependencyScanner::MissingDependencyScanner
            (&this->scanner_,&(this->delegate_).super_MissingDependencyScannerDelegate,
             &this->deps_log_,&this->state_,&(this->filesystem_).super_DiskInterface);
  std::__cxx11::string::string((string *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"MissingDepTest-tempdepslog",&local_b1);
  DepsLog::OpenForWrite(&this->deps_log_,&local_b0,(string *)local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  this_00 = g_current_test;
  bVar1 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
  bVar1 = testing::Test::Check
                    (this_00,bVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x24,"\"\" == err");
  if (!bVar1) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

MissingDependencyScannerTest()
      : generator_rule_("generator_rule"), compile_rule_("compile_rule"),
        scanner_(&delegate_, &deps_log_, &state_, &filesystem_) {
    std::string err;
    deps_log_.OpenForWrite(kTestDepsLogFilename, &err);
    ASSERT_EQ("", err);
  }